

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPF.cpp
# Opt level: O0

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::IPF::get_track_at_position(IPF *this,Address address)

{
  bool bVar1;
  uint32_t uVar2;
  pointer ppVar3;
  reference pvVar4;
  size_t sVar5;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  shared_ptr<Storage::Disk::Track> sVar8;
  vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> local_118;
  Time local_100;
  long local_f8;
  long next_chunk;
  size_t length_1;
  Type type_1;
  uint8_t data_header;
  Time local_d8;
  Time local_d0;
  size_t local_c8;
  size_t length;
  Type type;
  uint8_t gap_header;
  Time length_of_a_bit;
  BlockDescriptor *block_1;
  iterator __end1;
  iterator __begin1;
  vector<BlockDescriptor,_std::allocator<BlockDescriptor>_> *__range1;
  undefined1 local_88 [4];
  int block_count;
  vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> segments;
  uint32_t flags;
  value_type *block;
  uint32_t c;
  undefined1 local_50 [8];
  vector<BlockDescriptor,_std::allocator<BlockDescriptor>_> blocks;
  TrackDescription *description;
  _Self local_28;
  iterator pair;
  IPF *this_local;
  Address address_local;
  
  pair._M_node = (_Base_ptr)address;
  address_local = (Address)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>_>
       ::find((map<Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>_>
               *)((long)address + 0x100),(key_type *)&this_local);
  description = (TrackDescription *)
                std::
                map<Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>_>
                ::end((map<Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>_>
                       *)((long)address + 0x100));
  bVar1 = std::operator==(&local_28,(_Self *)&description);
  if (bVar1) {
    std::shared_ptr<Storage::Disk::Track>::shared_ptr
              ((shared_ptr<Storage::Disk::Track> *)this,(nullptr_t)0x0);
    _Var7._M_pi = extraout_RDX;
  }
  else {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>
             ::operator->(&local_28);
    blocks.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&ppVar3->second;
    if (((TrackDescription *)
        blocks.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage)->file_offset == 0) {
      std::shared_ptr<Storage::Disk::Track>::shared_ptr
                ((shared_ptr<Storage::Disk::Track> *)this,(nullptr_t)0x0);
      _Var7._M_pi = extraout_RDX_00;
    }
    else {
      FileHolder::seek((FileHolder *)((long)address + 0x10),
                       ((TrackDescription *)
                       blocks.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage)->file_offset,0);
      std::vector<BlockDescriptor,_std::allocator<BlockDescriptor>_>::vector
                ((vector<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)local_50);
      std::vector<BlockDescriptor,_std::allocator<BlockDescriptor>_>::reserve
                ((vector<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)local_50,
                 (ulong)blocks.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage[1].data_bits);
      for (block._0_4_ = 0;
          (uint)block <
          blocks.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[1].data_bits; block._0_4_ = (uint)block + 1) {
        pvVar4 = std::vector<BlockDescriptor,_std::allocator<BlockDescriptor>_>::emplace_back<>
                           ((vector<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)local_50);
        uVar2 = FileHolder::get32be((FileHolder *)((long)address + 0x10));
        pvVar4->data_bits = uVar2;
        uVar2 = FileHolder::get32be((FileHolder *)((long)address + 0x10));
        pvVar4->gap_bits = uVar2;
        if ((*(byte *)((long)address + 0x130) & 1) == 0) {
          FileHolder::seek((FileHolder *)((long)address + 0x10),8,1);
        }
        else {
          uVar2 = FileHolder::get32be((FileHolder *)((long)address + 0x10));
          pvVar4->gap_offset = uVar2;
          FileHolder::seek((FileHolder *)((long)address + 0x10),4,1);
        }
        uVar2 = FileHolder::get32be((FileHolder *)((long)address + 0x10));
        pvVar4->is_mfm = uVar2 == 1;
        segments.
        super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             FileHolder::get32be((FileHolder *)((long)address + 0x10));
        pvVar4->has_forward_gap =
             (bool)(segments.
                    super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ & 1);
        pvVar4->has_backwards_gap =
             SUB41((segments.
                    super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ & 2) >> 1,0);
        pvVar4->data_unit_is_bits =
             SUB41((segments.
                    super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ & 4) >> 2,0);
        uVar2 = FileHolder::get32be((FileHolder *)((long)address + 0x10));
        pvVar4->default_gap_value = uVar2;
        uVar2 = FileHolder::get32be((FileHolder *)((long)address + 0x10));
        pvVar4->data_offset = uVar2;
      }
      std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::vector
                ((vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *)
                 local_88);
      __range1._4_4_ = 0;
      __end1 = std::vector<BlockDescriptor,_std::allocator<BlockDescriptor>_>::begin
                         ((vector<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)local_50);
      block_1 = (BlockDescriptor *)
                std::vector<BlockDescriptor,_std::allocator<BlockDescriptor>_>::end
                          ((vector<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)local_50);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<BlockDescriptor_*,_std::vector<BlockDescriptor,_std::allocator<BlockDescriptor>_>_>
                                         *)&block_1), bVar1) {
        length_of_a_bit =
             (Time)__gnu_cxx::
                   __normal_iterator<BlockDescriptor_*,_std::vector<BlockDescriptor,_std::allocator<BlockDescriptor>_>_>
                   ::operator*(&__end1);
        _type = bit_length((IPF *)address,
                           (blocks.
                            super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage)->gap_offset,
                           __range1._4_4_);
        if (*(int *)((long)length_of_a_bit + 8) == 0) {
          if (*(int *)((long)length_of_a_bit + 4) != 0) {
            _type_1 = _type;
            add_gap((IPF *)address,
                    (vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *
                    )local_88,_type,(ulong)*(uint *)((long)length_of_a_bit + 4),
                    *(uint32_t *)((long)length_of_a_bit + 0x10));
          }
        }
        else {
          FileHolder::seek((FileHolder *)((long)address + 0x10),
                           *(long *)blocks.
                                    super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage +
                           (ulong)*(uint *)((long)length_of_a_bit + 8),0);
          while (length._7_1_ = FileHolder::get8((FileHolder *)((long)address + 0x10)),
                length._7_1_ != 0) {
            length._0_4_ = length._7_1_ & 0x1f;
            local_c8 = anon_unknown.dwarf_f1c1f8::block_size
                                 ((FileHolder *)((long)address + 0x10),length._7_1_);
            if ((uint)length == 1) {
              printf("Adding gap length %zu bits\n",local_c8);
              local_d0 = _type;
              add_gap((IPF *)address,
                      (vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
                       *)local_88,_type,local_c8,*(uint32_t *)((long)length_of_a_bit + 0x10));
            }
            else {
              printf("Adding sampled gap length %zu bits\n",local_c8);
              local_d8 = _type;
              add_raw_data((IPF *)address,
                           (vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
                            *)local_88,_type,local_c8);
            }
          }
        }
        if (*(int *)((long)length_of_a_bit + 0x14) != 0) {
          FileHolder::seek((FileHolder *)((long)address + 0x10),
                           *(long *)blocks.
                                    super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage +
                           (ulong)*(uint *)((long)length_of_a_bit + 0x14),0);
          while (length_1._7_1_ = FileHolder::get8((FileHolder *)((long)address + 0x10)),
                length_1._7_1_ != 0) {
            length_1._0_4_ = length_1._7_1_ & 0x1f;
            sVar5 = anon_unknown.dwarf_f1c1f8::block_size
                              ((FileHolder *)((long)address + 0x10),length_1._7_1_);
            lVar6 = 8;
            if ((*(byte *)((long)length_of_a_bit + 0xf) & 1) != 0) {
              lVar6 = 1;
            }
            next_chunk = sVar5 * lVar6;
            local_f8 = FileHolder::tell((FileHolder *)((long)address + 0x10));
            local_f8 = local_f8 + ((ulong)next_chunk >> 3);
            if ((uint)length_1 == 1) {
LAB_0096ea0b:
              local_118.
              super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)_type;
              add_raw_data((IPF *)address,
                           (vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
                            *)local_88,_type,next_chunk);
            }
            else if ((uint)length_1 - 2 < 2) {
              local_100 = _type;
              add_unencoded_data((IPF *)address,
                                 (vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
                                  *)local_88,_type,next_chunk);
            }
            else {
              if ((uint)length_1 == 4) goto LAB_0096ea0b;
              printf("Unhandled data type %d, length %zu bits\n",(ulong)(uint)length_1,next_chunk);
            }
            lVar6 = FileHolder::tell((FileHolder *)((long)address + 0x10));
            if (lVar6 != local_f8) {
              __assert_fail("file_.tell() == next_chunk",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/Disk/DiskImage/Formats/IPF.cpp"
                            ,0x135,
                            "virtual std::shared_ptr<Track> Storage::Disk::IPF::get_track_at_position(Track::Address)"
                           );
            }
          }
        }
        __range1._4_4_ = __range1._4_4_ + 1;
        __gnu_cxx::
        __normal_iterator<BlockDescriptor_*,_std::vector<BlockDescriptor,_std::allocator<BlockDescriptor>_>_>
        ::operator++(&__end1);
      }
      std::
      make_shared<Storage::Disk::PCMTrack,std::vector<Storage::Disk::PCMSegment,std::allocator<Storage::Disk::PCMSegment>>&>
                (&local_118);
      std::shared_ptr<Storage::Disk::Track>::shared_ptr<Storage::Disk::PCMTrack,void>
                ((shared_ptr<Storage::Disk::Track> *)this,
                 (shared_ptr<Storage::Disk::PCMTrack> *)&local_118);
      std::shared_ptr<Storage::Disk::PCMTrack>::~shared_ptr
                ((shared_ptr<Storage::Disk::PCMTrack> *)&local_118);
      std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::~vector
                ((vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *)
                 local_88);
      std::vector<BlockDescriptor,_std::allocator<BlockDescriptor>_>::~vector
                ((vector<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)local_50);
      _Var7._M_pi = extraout_RDX_01;
    }
  }
  sVar8.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  sVar8.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Storage::Disk::Track>)
         sVar8.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Track> IPF::get_track_at_position([[maybe_unused]] Track::Address address) {
	// Get the track description, if it exists, and check either that the file has contents for the track.
	auto pair = tracks_.find(address);
	if(pair == tracks_.end()) {
		return nullptr;
	}
	const TrackDescription &description = pair->second;
	if(!description.file_offset) {
		return nullptr;
	}

	// Seek to track content.
	file_.seek(description.file_offset, SEEK_SET);

	// Read the block descriptions up front.
	//
	// This is less efficient than just seeking for each block in turn,
	// but is a useful crutch to comprehension of the file format on a
	// first run through.
	struct BlockDescriptor {
		uint32_t data_bits = 0;
		uint32_t gap_bits = 0;
		uint32_t gap_offset = 0;
		bool is_mfm = false;
		bool has_forward_gap = false;
		bool has_backwards_gap = false;
		bool data_unit_is_bits = false;
		uint32_t default_gap_value = 0;
		uint32_t data_offset = 0;
	};
	std::vector<BlockDescriptor> blocks;
	blocks.reserve(description.block_count);
	for(uint32_t c = 0; c < description.block_count; c++) {
		auto &block = blocks.emplace_back();
		block.data_bits = file_.get32be();
		block.gap_bits = file_.get32be();
		if(is_sps_format_) {
			block.gap_offset = file_.get32be();
			file_.seek(4, SEEK_CUR);	// Skip 'cell type' which appears to provide no content.
		} else {
			// Skip potlower-resolution copies of data_bits and gap_bits.
			file_.seek(8, SEEK_CUR);
		}
		block.is_mfm = file_.get32be() == 1;

		const uint32_t flags = file_.get32be();
		block.has_forward_gap = flags & 1;
		block.has_backwards_gap = flags & 2;
		block.data_unit_is_bits = flags & 4;

		block.default_gap_value = file_.get32be();
		block.data_offset = file_.get32be();
	}

	std::vector<Storage::Disk::PCMSegment> segments;
	int block_count = 0;
	for(auto &block: blocks) {
		const auto length_of_a_bit = bit_length(description.density, block_count);

		if(block.gap_offset) {
			file_.seek(description.file_offset + block.gap_offset, SEEK_SET);
			while(true) {
				const uint8_t gap_header = file_.get8();
				if(!gap_header) break;

				// Decompose the header and read the length.
				enum class Type {
					None, GapLength, SampleLength
				} type = Type(gap_header & 0x1f);
				const size_t length = block_size(file_, gap_header);

				switch(type) {
					case Type::GapLength:
						printf("Adding gap length %zu bits\n", length);
						add_gap(segments, length_of_a_bit, length, block.default_gap_value);
					break;

					default:
					case Type::SampleLength:
						printf("Adding sampled gap length %zu bits\n", length);
						add_raw_data(segments, length_of_a_bit, length);
//						file_.seek(long(length >> 3), SEEK_CUR);
					break;
				}
			}
		} else if(block.gap_bits) {
			add_gap(segments, length_of_a_bit, block.gap_bits, block.default_gap_value);
		}

		if(block.data_offset) {
			file_.seek(description.file_offset + block.data_offset, SEEK_SET);
			while(true) {
				const uint8_t data_header = file_.get8();
				if(!data_header) break;

				// Decompose the header and read the length.
				enum class Type {
					None, Sync, Data, Gap, Raw, Fuzzy
				} type = Type(data_header & 0x1f);
				const size_t length = block_size(file_, data_header) * (block.data_unit_is_bits ? 1 : 8);
#ifndef NDEBUG
				const auto next_chunk = file_.tell() + long(length >> 3);
#endif

				switch(type) {
					case Type::Gap:
					case Type::Data:
						add_unencoded_data(segments, length_of_a_bit, length);
					break;

					case Type::Sync:
					case Type::Raw:
						add_raw_data(segments, length_of_a_bit, length);
					break;

					default:
						printf("Unhandled data type %d, length %zu bits\n", int(type), length);
					break;
				}

				assert(file_.tell() == next_chunk);
			}
		}

		++block_count;
	}

	return std::make_shared<Storage::Disk::PCMTrack>(segments);
}